

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::es30::isCoreTextureParam(GLenum pname)

{
  if ((int)pname < 0x82df) {
    if (((3 < pname - 0x2800) && (3 < pname - 0x813a)) && (pname != 0x8072)) {
      return false;
    }
  }
  else if ((int)pname < 0x8e42) {
    if ((1 < pname - 0x884c) && (pname != 0x82df)) {
      return false;
    }
  }
  else if ((3 < pname - 0x8e42) && (pname != 0x912f)) {
    return false;
  }
  return true;
}

Assistant:

static bool isCoreTextureParam (glw::GLenum pname)
{
	return	pname == GL_TEXTURE_BASE_LEVEL			||
			pname == GL_TEXTURE_COMPARE_MODE		||
			pname == GL_TEXTURE_COMPARE_FUNC		||
			pname == GL_TEXTURE_MAG_FILTER			||
			pname == GL_TEXTURE_MAX_LEVEL			||
			pname == GL_TEXTURE_MAX_LOD				||
			pname == GL_TEXTURE_MIN_FILTER			||
			pname == GL_TEXTURE_MIN_LOD				||
			pname == GL_TEXTURE_SWIZZLE_R			||
			pname == GL_TEXTURE_SWIZZLE_G			||
			pname == GL_TEXTURE_SWIZZLE_B			||
			pname == GL_TEXTURE_SWIZZLE_A			||
			pname == GL_TEXTURE_WRAP_S				||
			pname == GL_TEXTURE_WRAP_T				||
			pname == GL_TEXTURE_WRAP_R				||
			pname == GL_TEXTURE_IMMUTABLE_FORMAT	||
			pname == GL_TEXTURE_IMMUTABLE_LEVELS;
}